

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* parseCmdArguments_abi_cxx11_(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  mapped_type *this;
  long in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  int last;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *res;
  undefined4 in_stack_ffffffffffffff78;
  char __c;
  char *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  string local_48 [36];
  int local_24;
  undefined1 local_1d;
  int local_1c;
  long local_18;
  
  local_1d = 0;
  this_00 = in_RDI;
  local_1c = in_ESI;
  local_18 = in_RDX;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1572f0);
  for (local_24 = 1; local_24 < local_1c; local_24 = local_24 + 1) {
    if ((**(char **)(local_18 + (long)local_24 * 8) == '-') &&
       (sVar2 = strlen(*(char **)(local_18 + (long)local_24 * 8)), 1 < sVar2)) {
      sVar2 = strlen(*(char **)(local_18 + (long)local_24 * 8));
      if (sVar2 < 3) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (char *)(*(long *)(local_18 + (long)local_24 * 8) + 2);
      }
      iVar1 = (int)*(char *)(*(long *)(local_18 + (long)local_24 * 8) + 1);
      __c = (char)((ulong)&stack0xffffffffffffffb7 >> 0x38);
      __n = pcVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(size_type)__n,__c,
                 (allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::operator=((string *)this,pcVar3);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    }
  }
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

std::map<std::string, std::string> parseCmdArguments(int argc, char ** argv) {
    int last = argc;
    std::map<std::string, std::string> res;
    for (int i = 1; i < last; ++i) {
        if (argv[i][0] == '-') {
            if (strlen(argv[i]) > 1) {
                res[std::string(1, argv[i][1])] = strlen(argv[i]) > 2 ? argv[i] + 2 : "";
            }
        }
    }

    return res;
}